

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_schnorrsig_verify
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_xonly_pubkey *pubkey)

{
  secp256k1_fe *r_00;
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  secp256k1_gej *r_01;
  uchar *data;
  secp256k1_gej *data_00;
  secp256k1_fe *r_02;
  secp256k1_scalar *data_01;
  int overflow;
  secp256k1_fe rx;
  secp256k1_scalar s;
  uchar buf [32];
  secp256k1_scalar e;
  secp256k1_ge pk;
  secp256k1_gej pkj;
  secp256k1_gej rj;
  secp256k1_ge r;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  uchar auStack_c10 [32];
  secp256k1_sha256 sStack_bf0;
  secp256k1_fe *psStack_b80;
  uchar *puStack_b78;
  secp256k1_scalar *psStack_b70;
  secp256k1_gej *psStack_b68;
  code *pcStack_b60;
  int local_b54;
  secp256k1_fe local_b50;
  secp256k1_scalar local_b20;
  secp256k1_strauss_state local_b00;
  uchar local_ae8 [40];
  secp256k1_scalar local_ac0;
  secp256k1_ge local_aa0;
  secp256k1_gej local_a38;
  secp256k1_gej local_9a0;
  undefined1 local_908 [92];
  int local_8ac;
  int local_8a8;
  secp256k1_fe local_4f8 [8];
  secp256k1_ge local_378 [8];
  
  if (ctx == (secp256k1_context *)0x0) {
    pcStack_b60 = (code *)0x124b68;
    secp256k1_schnorrsig_verify_cold_5();
  }
  else if (sig64 != (uchar *)0x0) {
    if (msglen != 0 && msg == (uchar *)0x0) {
      pcStack_b60 = (code *)0x124b7d;
      secp256k1_schnorrsig_verify_cold_3();
      return 0;
    }
    if (pubkey == (secp256k1_xonly_pubkey *)0x0) {
      pcStack_b60 = (code *)0x124b8a;
      secp256k1_schnorrsig_verify_cold_2();
      return 0;
    }
    pcStack_b60 = (code *)0x1249ac;
    secp256k1_fe_impl_set_b32_mod(&local_b50,sig64);
    bVar1 = (local_b50.n[2] & local_b50.n[3] & local_b50.n[1]) == 0xfffffffffffff;
    if (0xffffefffffc2e < local_b50.n[0] && (bVar1 && local_b50.n[4] == 0xffffffffffff)) {
      local_b50.magnitude = -1;
    }
    else {
      local_b50.magnitude = 1;
      local_b50.normalized = 1;
      pcStack_b60 = (code *)0x124a0f;
      secp256k1_fe_verify(&local_b50);
    }
    if (0xffffefffffc2e < local_b50.n[0] && (bVar1 && local_b50.n[4] == 0xffffffffffff)) {
      return 0;
    }
    pcStack_b60 = (code *)0x124a2c;
    secp256k1_scalar_set_b32(&local_b20,sig64 + 0x20,&local_b54);
    if (local_b54 != 0) {
      return 0;
    }
    pcStack_b60 = (code *)0x124a58;
    iVar2 = secp256k1_pubkey_load(ctx,&local_aa0,(secp256k1_pubkey *)pubkey);
    if (iVar2 == 0) {
      return 0;
    }
    pcStack_b60 = (code *)0x124a74;
    secp256k1_fe_get_b32(local_ae8,&local_aa0.x);
    pcStack_b60 = (code *)0x124a90;
    secp256k1_schnorrsig_challenge(&local_ac0,sig64,msg,msglen,local_ae8);
    pcStack_b60 = (code *)0x124a9b;
    secp256k1_scalar_negate(&local_ac0,&local_ac0);
    r_01 = &local_a38;
    pcStack_b60 = (code *)0x124aae;
    secp256k1_gej_set_ge(r_01,&local_aa0);
    local_b00.aux = local_4f8;
    local_b00.pre_a = local_378;
    local_b00.ps = (secp256k1_strauss_point_state *)local_908;
    pcStack_b60 = (code *)0x124af6;
    data_01 = &local_ac0;
    secp256k1_ecmult_strauss_wnaf(&local_b00,&local_9a0,1,r_01,&local_ac0,&local_b20);
    pcStack_b60 = (code *)0x124b09;
    data_00 = &local_9a0;
    secp256k1_ge_set_gej_var((secp256k1_ge *)local_908,&local_9a0);
    pcStack_b60 = (code *)0x124b11;
    secp256k1_ge_verify((secp256k1_ge *)local_908);
    if (local_8a8 != 0) {
      return 0;
    }
    r_00 = (secp256k1_fe *)(local_908 + 0x30);
    pcStack_b60 = (code *)0x124b2b;
    secp256k1_fe_normalize_var(r_00);
    pcStack_b60 = (code *)0x124b33;
    r_02 = r_00;
    secp256k1_fe_verify(r_00);
    if (local_8ac != 0) {
      if ((local_908[0x30] & 1) == 0) {
        pcStack_b60 = (code *)0x124b5e;
        iVar2 = secp256k1_fe_equal(&local_b50,(secp256k1_fe *)local_908);
        return iVar2;
      }
      return 0;
    }
    pcStack_b60 = secp256k1_schnorrsig_challenge;
    secp256k1_schnorrsig_verify_cold_1();
    sStack_bf0.s[0] = 0x9cecba11;
    sStack_bf0.s[1] = 0x23925381;
    sStack_bf0.s[2] = 0x11679112;
    sStack_bf0.s[3] = 0xd1627e0f;
    sStack_bf0.s[4] = 0x97c87550;
    sStack_bf0.s[5] = 0x3cc765;
    sStack_bf0.s[6] = 0x90f61164;
    sStack_bf0.s[7] = 0x33e9b66a;
    sStack_bf0.bytes = 0x40;
    psStack_b80 = r_00;
    puStack_b78 = sig64;
    psStack_b70 = &local_ac0;
    psStack_b68 = &local_9a0;
    pcStack_b60 = (code *)msg;
    secp256k1_sha256_write(&sStack_bf0,(uchar *)data_00,0x20);
    secp256k1_sha256_write(&sStack_bf0,(uchar *)data_01,0x20);
    secp256k1_sha256_write(&sStack_bf0,data,(size_t)r_01);
    secp256k1_sha256_finalize(&sStack_bf0,auStack_c10);
    secp256k1_scalar_set_b32((secp256k1_scalar *)r_02,auStack_c10,(int *)0x0);
    return extraout_EAX;
  }
  pcStack_b60 = (code *)0x124b70;
  secp256k1_schnorrsig_verify_cold_4();
  return 0;
}

Assistant:

int secp256k1_schnorrsig_verify(const secp256k1_context* ctx, const unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_scalar s;
    secp256k1_scalar e;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_gej pkj;
    secp256k1_fe rx;
    secp256k1_ge r;
    unsigned char buf[32];
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_fe_set_b32_limit(&rx, &sig64[0])) {
        return 0;
    }

    secp256k1_scalar_set_b32(&s, &sig64[32], &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }

    /* Compute e. */
    secp256k1_fe_get_b32(buf, &pk.x);
    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, buf);

    /* Compute rj =  s*G + (-e)*pkj */
    secp256k1_scalar_negate(&e, &e);
    secp256k1_gej_set_ge(&pkj, &pk);
    secp256k1_ecmult(&rj, &pkj, &e, &s);

    secp256k1_ge_set_gej_var(&r, &rj);
    if (secp256k1_ge_is_infinity(&r)) {
        return 0;
    }

    secp256k1_fe_normalize_var(&r.y);
    return !secp256k1_fe_is_odd(&r.y) &&
           secp256k1_fe_equal(&rx, &r.x);
}